

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  uchar *__ptr;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  uchar *puVar12;
  float *pfVar13;
  long lVar14;
  float fVar15;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    __ptr = stbi__load_flip(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar2 = *y * *x;
      pfVar4 = (float *)malloc((long)(int)(req_comp * uVar2) << 2);
      if (pfVar4 != (float *)0x0) {
        if (0 < (int)uVar2) {
          uVar5 = (req_comp + (req_comp & 1U)) - 1;
          lVar6 = (long)req_comp;
          uVar8 = 0;
          puVar12 = __ptr;
          pfVar9 = pfVar4;
          do {
            uVar3 = 0;
            if (0 < (int)uVar5) {
              uVar11 = 0;
              do {
                fVar15 = powf((float)puVar12[uVar11] / 255.0,stbi__l2h_gamma);
                pfVar9[uVar11] = fVar15 * stbi__l2h_scale;
                uVar11 = uVar11 + 1;
                uVar3 = uVar5;
              } while (uVar5 != uVar11);
            }
            if ((int)uVar3 < req_comp) {
              lVar14 = (ulong)uVar3 + uVar8 * lVar6;
              pfVar4[lVar14] = (float)__ptr[lVar14] / 255.0;
            }
            uVar8 = uVar8 + 1;
            pfVar9 = pfVar9 + lVar6;
            puVar12 = puVar12 + lVar6;
          } while (uVar8 != uVar2);
        }
        free(__ptr);
        return pfVar4;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
  }
  else {
    pfVar4 = stbi__hdr_load(s,x,y,comp,req_comp);
    if (pfVar4 != (float *)0x0) {
      if (stbi__vertically_flip_on_load == 0) {
        return pfVar4;
      }
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar2 = *y >> 1;
      if ((int)uVar2 < 1) {
        return pfVar4;
      }
      iVar1 = *x;
      lVar6 = (long)req_comp;
      iVar7 = (*y + -1) * iVar1;
      uVar8 = 0;
      pfVar9 = pfVar4;
      do {
        if (0 < iVar1) {
          pfVar10 = (float *)((long)iVar7 * lVar6 * 4 + (long)pfVar4);
          lVar14 = 0;
          pfVar13 = pfVar9;
          do {
            if (0 < req_comp) {
              uVar11 = 0;
              do {
                fVar15 = pfVar13[uVar11];
                pfVar13[uVar11] = pfVar10[uVar11];
                pfVar10[uVar11] = fVar15;
                uVar11 = uVar11 + 1;
              } while ((uint)req_comp != uVar11);
            }
            lVar14 = lVar14 + 1;
            pfVar10 = pfVar10 + lVar6;
            pfVar13 = pfVar13 + lVar6;
          } while (lVar14 != iVar1);
        }
        uVar8 = uVar8 + 1;
        iVar7 = iVar7 - iVar1;
        pfVar9 = pfVar9 + lVar6 * iVar1;
      } while (uVar8 != uVar2);
      return pfVar4;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}